

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O0

int ffikyd(fitsfile *fptr,char *keyname,double value,int decim,char *comm,int *status)

{
  char local_e8 [8];
  char card [81];
  char local_88 [8];
  char valstring [71];
  int *status_local;
  char *comm_local;
  int decim_local;
  double value_local;
  char *keyname_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    unique0x10000067 = status;
    ffd2e(value,decim,local_88,status);
    ffmkky(keyname,local_88,comm,local_e8,stack0xffffffffffffffc0);
    ffikey(fptr,local_e8,stack0xffffffffffffffc0);
    fptr_local._4_4_ = *stack0xffffffffffffffc0;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffikyd(fitsfile *fptr,          /* I - FITS file pointer  */
           const char *keyname,     /* I - keyword name       */
           double value,            /* I - keyword value      */
           int decim,               /* I - no of decimals     */
           const char *comm,        /* I - keyword comment    */ 
           int *status)             /* IO - error status      */
{
    char valstring[FLEN_VALUE];
    char card[FLEN_CARD];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    ffd2e(value, decim, valstring, status);   /* convert to formatted string */
    ffmkky(keyname, valstring, comm, card, status);  /* construct the keyword*/
    ffikey(fptr, card, status);  /* write the keyword*/

    return(*status);
}